

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

Orphan<capnp::DynamicValue> * __thiscall
capnp::JsonCodec::decode
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,JsonCodec *this,
          ArrayPtr<const_char> input,Type type,Orphanage orphanage)

{
  Builder output;
  Reader input_00;
  Builder json;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::json::Value>(&json,&message.super_MessageBuilder);
  output._builder.capTable = json._builder.capTable;
  output._builder.segment = json._builder.segment;
  output._builder.data = json._builder.data;
  output._builder.pointers = json._builder.pointers;
  output._builder.dataSize = json._builder.dataSize;
  output._builder.pointerCount = json._builder.pointerCount;
  output._builder._38_2_ = json._builder._38_2_;
  decodeRaw(this,input,output);
  capnp::_::StructBuilder::asReader(&json._builder);
  input_00._reader.capTable = (CapTableReader *)uStack_148;
  input_00._reader.segment = (SegmentReader *)local_150;
  input_00._reader.data = (void *)local_140;
  input_00._reader.pointers = (WirePointer *)uStack_138;
  input_00._reader._32_8_ = local_130;
  input_00._reader._40_8_ = uStack_128;
  decode(__return_storage_ptr__,this,input_00,type,orphanage);
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> JsonCodec::decode(
    kj::ArrayPtr<const char> input, Type type, Orphanage orphanage) const {
  MallocMessageBuilder message;
  auto json = message.getRoot<JsonValue>();
  decodeRaw(input, json);
  return decode(json, type, orphanage);
}